

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcStructuralMember::~IfcStructuralMember(IfcStructuralMember *this)

{
  Maybe<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProductRepresentation>_> *pMVar1;
  undefined1 *puVar2;
  _func_int **pp_Var3;
  undefined1 *puVar4;
  
  *(undefined8 *)&this[-1].super_IfcStructuralItem.super_IfcProduct.super_IfcObject.field_0x38 =
       0x859018;
  *(undefined8 *)&(this->super_IfcStructuralItem).super_IfcProduct.super_IfcObject.field_0x20 =
       0x859090;
  *(undefined8 *)&this[-1].super_IfcStructuralItem.super_IfcProduct.super_IfcObject.field_0xc0 =
       0x859040;
  *(undefined8 *)&this[-1].super_IfcStructuralItem.super_IfcProduct.super_IfcObject.field_0xd0 =
       0x859068;
  puVar2 = *(undefined1 **)
            &this[-1].super_IfcStructuralItem.super_IfcProduct.super_IfcObject.field_0xe0;
  pMVar1 = &this[-1].super_IfcStructuralItem.super_IfcProduct.Representation;
  if ((Maybe<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProductRepresentation>_> *)puVar2 !=
      pMVar1) {
    operator_delete(puVar2,(ulong)((long)&((pMVar1->ptr).obj)->id + 1));
  }
  *(undefined8 *)&this[-1].super_IfcStructuralItem.super_IfcProduct.super_IfcObject.field_0x38 =
       0x859130;
  *(undefined8 *)&(this->super_IfcStructuralItem).super_IfcProduct.super_IfcObject.field_0x20 =
       0x859158;
  pp_Var3 = this[-1].super_IfcStructuralItem.super_IfcProduct.super_IfcObject.
            super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper;
  puVar2 = &this[-1].super_IfcStructuralItem.super_IfcProduct.super_IfcObject.
            super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.field_0x10;
  if (pp_Var3 != (_func_int **)puVar2) {
    operator_delete(pp_Var3,*(long *)puVar2 + 1);
  }
  puVar4 = *(undefined1 **)
            &this[-1].super_IfcStructuralItem.super_IfcProduct.super_IfcObject.field_0x70;
  puVar2 = &this[-1].super_IfcStructuralItem.super_IfcProduct.super_IfcObject.field_0x80;
  if (puVar4 != puVar2) {
    operator_delete(puVar4,*(long *)puVar2 + 1);
  }
  puVar2 = *(undefined1 **)
            &this[-1].super_IfcStructuralItem.super_IfcProduct.super_IfcObject.field_0x48;
  puVar4 = &this[-1].super_IfcStructuralItem.super_IfcProduct.super_IfcObject.field_0x58;
  if (puVar2 != puVar4) {
    operator_delete(puVar2,*(long *)puVar4 + 1);
  }
  operator_delete(&this[-1].super_IfcStructuralItem.super_IfcProduct.super_IfcObject.field_0x38,
                  0x138);
  return;
}

Assistant:

IfcStructuralMember() : Object("IfcStructuralMember") {}